

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

DecimalFormat * __thiscall icu_63::DecimalFormat::operator=(DecimalFormat *this,DecimalFormat *rhs)

{
  DecimalFormatFields *pDVar1;
  DecimalFormatProperties *size;
  DecimalFormatProperties *pDVar2;
  DecimalFormatSymbols *this_00;
  DecimalFormatSymbols *source;
  DecimalFormatSymbols *local_38;
  DecimalFormat *rhs_local;
  DecimalFormat *this_local;
  
  size = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator*
                   ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)rhs->fields);
  pDVar2 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator*
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  icu_63::number::impl::DecimalFormatProperties::operator=(pDVar2,size);
  pDVar2 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     (&(this->fields->exportedProperties).
                       super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>);
  icu_63::number::impl::DecimalFormatProperties::clear(pDVar2);
  pDVar1 = this->fields;
  this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)size);
  local_38 = (DecimalFormatSymbols *)0x0;
  if (this_00 != (DecimalFormatSymbols *)0x0) {
    source = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator*
                       (&(rhs->fields->symbols).
                         super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>);
    DecimalFormatSymbols::DecimalFormatSymbols(this_00,source);
    local_38 = this_00;
  }
  LocalPointer<const_icu_63::DecimalFormatSymbols>::adoptInstead(&pDVar1->symbols,local_38);
  touchNoError(this);
  return this;
}

Assistant:

DecimalFormat& DecimalFormat::operator=(const DecimalFormat& rhs) {
    *fields->properties = *rhs.fields->properties;
    fields->exportedProperties->clear();
    fields->symbols.adoptInstead(new DecimalFormatSymbols(*rhs.fields->symbols));
    touchNoError();
    return *this;
}